

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_util_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::
BufferUtilTest_test_hex_buffer_with_empty_string_create_an_empty_buffer_Test::TestBody
          (BufferUtilTest_test_hex_buffer_with_empty_string_create_an_empty_buffer_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  int local_7c;
  AssertHelper local_78 [2];
  undefined1 local_68 [16];
  internal local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [6];
  unsigned_long local_18;
  
  local_7c = 0;
  message = "";
  local_78[0].data_ = (AssertHelperData *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"","");
  bidfx_public_api::tools::BufferUtil::HexBuffer((string *)local_48);
  local_18 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_58,"0","BufferUtil::HexBuffer(\"\").ReadableBytes()",&local_7c,&local_18);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_48);
  if (local_78[0].data_ != (AssertHelperData *)local_68) {
    operator_delete(local_78[0].data_,local_68._0_8_ + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if (local_50.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/buffer_util_test.cpp"
               ,0x18,message);
    testing::internal::AssertHelper::operator=(local_78,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    if (local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48[0].ptr_ + 8))();
      }
      local_48[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(BufferUtilTest, test_hex_buffer_with_empty_string_create_an_empty_buffer)
{
    ASSERT_EQ(0, BufferUtil::HexBuffer("").ReadableBytes());
}